

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall Epoll::epoll_add(Epoll *this,int fd,int event,EventCallback *cb)

{
  unordered_map<int,_Epoll::io_event,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  Logger *pLVar4;
  ulong uVar5;
  long lVar6;
  int fd_local;
  epoll_event ev;
  
  this_00 = &this->ep_event_map;
  fd_local = fd;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&fd_local);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>._M_cur ==
      (__node_type *)0x0) {
    iVar1 = 1;
    uVar5 = (ulong)(uint)event;
  }
  else {
    uVar5 = (ulong)(*(uint *)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_int,_Epoll::io_event>,_false>
                                    ._M_cur + 0x10) | event);
    iVar1 = 3;
  }
  if ((event & 1U) == 0) {
    if ((event & 4U) == 0) goto LAB_00108c91;
    lVar6 = 0x28;
  }
  else {
    lVar6 = 8;
  }
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&fd_local);
  std::function<void_()>::operator=((function<void_()> *)((long)&pmVar3->event + lVar6),cb);
LAB_00108c91:
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_Epoll::io_event>,_std::allocator<std::pair<const_int,_Epoll::io_event>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&fd_local);
  ev.events = (uint32_t)uVar5;
  pmVar3->event = ev.events;
  ev.data.fd = fd_local;
  iVar1 = epoll_ctl(this->ep_epoll_fd,iVar1,fd_local,(epoll_event *)&ev);
  if (iVar1 == -1) {
    if (-1 < pr_level) {
      printf("[%-5s][%s:%d] epoll ctl error for fd %d\n","error","epoll_add",0x2e,
             (ulong)(uint)fd_local);
    }
  }
  else {
    pLVar4 = Logger::get_instance();
    if ((pLVar4->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","epoll_add",0x31);
    }
    if (1 < (int)g_log_level) {
      pLVar4 = Logger::get_instance();
      Logger::write_log(pLVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/epoll.cpp"
                        ,"epoll_add",0x31,LOG_LEVEL_INFO,"epoll add, fd is %d, event is %d\n",
                        (ulong)(uint)fd_local,uVar5);
      pLVar4 = Logger::get_instance();
      Logger::flush(pLVar4);
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->ep_listen_fds,&fd_local);
  }
  return;
}

Assistant:

void Epoll::epoll_add(int fd, int event, const EventCallback& cb) {
    int final_events;
    int op;

    if (auto ret = ep_event_map.find(fd); ret == ep_event_map.end()) {
        final_events = event;    
        op = EPOLL_CTL_ADD;
    }
    else {
        final_events = ret->second.event | event;
        op = EPOLL_CTL_MOD;
    }

    if (event & EPOLLIN) {
        ep_event_map[fd].read_callback = cb;
    }
    else if (event & EPOLLOUT) {
        ep_event_map[fd].write_callback = cb;
    }
    
    ep_event_map[fd].event = final_events;

    struct epoll_event ev;
    ev.events = final_events;
    ev.data.fd = fd;
    if (epoll_ctl(ep_epoll_fd, op, fd, &ev) == -1) {
        PR_ERROR("epoll ctl error for fd %d\n", fd);
        return;
    }
LOG_INFO("epoll add, fd is %d, event is %d\n", fd, final_events);
    ep_listen_fds.insert(fd);
}